

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void TransformAC3_C(int16_t *in,uint8_t *dst)

{
  int iVar1;
  int iVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar6 = (int)*in;
  iVar1 = (int)in[4];
  iVar7 = iVar1 * 0x8a8c >> 0x10;
  iVar1 = (iVar1 * 0x4e7b >> 0x10) + iVar1;
  iVar2 = (int)in[1];
  iVar5 = iVar2 * 0x8a8c >> 0x10;
  iVar2 = (iVar2 * 0x4e7b >> 0x10) + iVar2;
  iVar8 = iVar6 + iVar1 + 4;
  iVar4 = (iVar8 + iVar2 >> 3) + (uint)*dst;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  *dst = uVar3;
  iVar4 = (iVar8 + iVar5 >> 3) + (uint)dst[1];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[1] = uVar3;
  iVar4 = (iVar8 - iVar5 >> 3) + (uint)dst[2];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[2] = uVar3;
  iVar4 = (iVar8 - iVar2 >> 3) + (uint)dst[3];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[3] = uVar3;
  iVar8 = iVar7 + iVar6 + 4;
  iVar4 = (iVar2 + iVar8 >> 3) + (uint)dst[0x20];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x20] = uVar3;
  iVar4 = (iVar8 + iVar5 >> 3) + (uint)dst[0x21];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x21] = uVar3;
  iVar4 = (iVar8 - iVar5 >> 3) + (uint)dst[0x22];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x22] = uVar3;
  iVar4 = (iVar8 - iVar2 >> 3) + (uint)dst[0x23];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x23] = uVar3;
  iVar7 = (iVar6 + 4) - iVar7;
  iVar4 = (iVar2 + iVar7 >> 3) + (uint)dst[0x40];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x40] = uVar3;
  iVar4 = (iVar7 + iVar5 >> 3) + (uint)dst[0x41];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x41] = uVar3;
  iVar4 = (iVar7 - iVar5 >> 3) + (uint)dst[0x42];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x42] = uVar3;
  iVar4 = (iVar7 - iVar2 >> 3) + (uint)dst[0x43];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x43] = uVar3;
  iVar1 = (iVar6 + 4) - iVar1;
  iVar4 = (iVar1 + iVar2 >> 3) + (uint)dst[0x60];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x60] = uVar3;
  iVar4 = (iVar1 + iVar5 >> 3) + (uint)dst[0x61];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x61] = uVar3;
  iVar4 = (iVar1 - iVar5 >> 3) + (uint)dst[0x62];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[0x62] = uVar3;
  iVar4 = (iVar1 - iVar2 >> 3) + (uint)dst[99];
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  dst[99] = uVar3;
  return;
}

Assistant:

static void TransformAC3_C(const int16_t* WEBP_RESTRICT in,
                           uint8_t* WEBP_RESTRICT dst) {
  const int a = in[0] + 4;
  const int c4 = WEBP_TRANSFORM_AC3_MUL2(in[4]);
  const int d4 = WEBP_TRANSFORM_AC3_MUL1(in[4]);
  const int c1 = WEBP_TRANSFORM_AC3_MUL2(in[1]);
  const int d1 = WEBP_TRANSFORM_AC3_MUL1(in[1]);
  STORE2(0, a + d4, d1, c1);
  STORE2(1, a + c4, d1, c1);
  STORE2(2, a - c4, d1, c1);
  STORE2(3, a - d4, d1, c1);
}